

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_le.c
# Opt level: O3

int utf16le_mbc_case_fold(OnigCaseFoldType flag,OnigUChar **pp,OnigUChar *end,OnigUChar *fold)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)(char)**pp;
  if ((-1 < lVar2) && ((*pp)[1] == '\0')) {
    *fold = ""[lVar2];
    fold[1] = '\0';
    *pp = *pp + 2;
    return 2;
  }
  iVar1 = onigenc_unicode_mbc_case_fold(&OnigEncodingUTF16_LE,flag,pp,end,fold);
  return iVar1;
}

Assistant:

static int
utf16le_mbc_case_fold(OnigCaseFoldType flag,
                      const UChar** pp, const UChar* end, UChar* fold)
{
  const UChar* p = *pp;

  if (ONIGENC_IS_ASCII_CODE(*p) && *(p+1) == 0) {
#ifdef USE_UNICODE_CASE_FOLD_TURKISH_AZERI
    if ((flag & ONIGENC_CASE_FOLD_TURKISH_AZERI) != 0) {
      if (*p == 0x49) {
        *fold++ = 0x31;
        *fold   = 0x01;
        (*pp) += 2;
        return 2;
      }
    }
#endif

    *fold++ = ONIGENC_ASCII_CODE_TO_LOWER_CASE(*p);
    *fold   = 0;
    *pp += 2;
    return 2;
  }
  else
    return onigenc_unicode_mbc_case_fold(ONIG_ENCODING_UTF16_LE, flag, pp, end,
                                         fold);
}